

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::SerializeBytes
          (Serializer<(Diligent::SerializerMode)0> *this,VoidPtr pBytes,ConstQual<size_t> *Size,
          size_t Alignment)

{
  TEnable<unsigned_int> TVar1;
  Char *Message;
  char (*in_R8) [8];
  undefined1 local_58 [8];
  string msg;
  Uint32 Size32;
  size_t Alignment_local;
  ConstQual<size_t> *Size_local;
  VoidPtr pBytes_local;
  Serializer<(Diligent::SerializerMode)0> *this_local;
  
  msg.field_2._12_4_ = 0;
  TVar1 = Serialize<unsigned_int>(this,(ConstQual<unsigned_int> *)(msg.field_2._M_local_buf + 0xc));
  if (TVar1) {
    *Size = (ulong)(uint)msg.field_2._12_4_;
    AlignOffset(this,Alignment);
    if (this->m_End < this->m_Ptr + *Size) {
      FormatString<char[26],unsigned_long,char[8]>
                ((string *)local_58,(Diligent *)"Note enough data to read ",(char (*) [26])Size,
                 (unsigned_long *)0x4870f7,in_R8);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"SerializeBytes",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Serializer.hpp"
                 ,0x18b);
      std::__cxx11::string::~string((string *)local_58);
      this_local._7_1_ = false;
    }
    else {
      *pBytes = this->m_Ptr;
      this->m_Ptr = this->m_Ptr + *Size;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Serializer<SerializerMode::Read>::SerializeBytes(VoidPtr pBytes, ConstQual<size_t>& Size, size_t Alignment)
{
    Uint32 Size32 = 0;
    if (!Serialize<Uint32>(Size32))
        return false;

    Size = Size32;

    AlignOffset(Alignment);

    CHECK_REMAINING_SIZE(Size, "Note enough data to read ", Size, " bytes.");

    pBytes = m_Ptr;
    m_Ptr += Size;

    return true;
}